

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::BrokenReplacer<kj::File>_>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DiskHandle::BrokenReplacer<kj::File>_> *this,
          void *pointer)

{
  if (pointer != (void *)0x0) {
    Own<const_kj::File>::dispose((Own<const_kj::File> *)((long)pointer + 0x10));
  }
  operator_delete(pointer,0x20);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }